

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::texparameterf(NegativeTestContext *ctx)

{
  bool bVar1;
  ContextType CVar2;
  allocator<char> local_39;
  string local_38;
  GLuint texture;
  
  texture = 0x1234;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,1,&texture);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0xde1,texture);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_ENUM is generated if target or pname is not one of the accepted defined values."
             ,&local_39);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0,0x2801,9729.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0,9729.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0,0,9729.0);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_ENUM is generated if pname is enum and the value of param(s) is not a valid value."
             ,&local_39);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x90ea,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x884c,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x884d,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x2800,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x2801,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x8e42,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x8e43,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x8e44,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x8e45,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x2802,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x2803,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x8072,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_VALUE is generated if pname is GL_TEXTURE_BASE_LEVEL or GL_TEXTURE_MAX_LEVEL and param(s) is negative."
             ,&local_39);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x813c,-1.0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x813d,-1.0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  CVar2.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(CVar2,(ApiType)0x23);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,
               "GL_INVALID_ENUM is generated if pname is a non-scalar parameter.",&local_39);
    NegativeTestContext::beginSection(ctx,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x1004,0.0);
    NegativeTestContext::expectError(ctx,0x500);
    NegativeTestContext::endSection(ctx);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_ENUM error is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname is not valid."
             ,&local_39);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9100,0x1004,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9100,0x2801,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9100,0x2800,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9100,0x2802,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9100,0x2803,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9100,0x8072,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9100,0x813a,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9100,0x813b,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9100,0x884c,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9100,0x884d,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  CVar2.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(CVar2,(ApiType)0x23);
  if (bVar1) {
LAB_0132f96f:
    glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9102,0x1004,-1.0);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9102,0x2801,-1.0);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9102,0x2800,-1.0);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9102,0x2802,-1.0);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9102,0x2803,-1.0);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9102,0x8072,-1.0);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9102,0x813a,-1.0);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9102,0x813b,-1.0);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9102,0x884c,-1.0);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9102,0x884d,-1.0);
    NegativeTestContext::expectError(ctx,0x500);
  }
  else {
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (ctx->m_ctxInfo,"GL_OES_texture_storage_multisample_2d_array");
    if (bVar1) goto LAB_0132f96f;
  }
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_OPERATION is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname GL_TEXTURE_BASE_LEVEL is not 0."
             ,&local_39);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9100,0x813c,1.0);
  NegativeTestContext::expectError(ctx,0x502);
  CVar2.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(CVar2,(ApiType)0x23);
  if (!bVar1) {
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (ctx->m_ctxInfo,"GL_OES_texture_storage_multisample_2d_array");
    if (!bVar1) goto LAB_0132fba4;
  }
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9102,0x813c,1.0);
  NegativeTestContext::expectError(ctx,0x502);
LAB_0132fba4:
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,1,&texture);
  return;
}

Assistant:

void texparameterf (NegativeTestContext& ctx)
{
	GLuint texture = 0x1234;
	GLfloat textureMode = -1.0f;
	ctx.glGenTextures(1, &texture);
	ctx.glBindTexture(GL_TEXTURE_2D, texture);

	ctx.beginSection("GL_INVALID_ENUM is generated if target or pname is not one of the accepted defined values.");
	ctx.glTexParameterf(0, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, 0, GL_LINEAR);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(0, 0, GL_LINEAR);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is enum and the value of param(s) is not a valid value.");
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_DEPTH_STENCIL_TEXTURE_MODE, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_MODE, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_FUNC, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_R, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_G, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_B, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_A, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_WRAP_R, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if pname is GL_TEXTURE_BASE_LEVEL or GL_TEXTURE_MAX_LEVEL and param(s) is negative.");
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_BASE_LEVEL, -1.0f);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_MAX_LEVEL, -1.0f);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)))
	{
		ctx.beginSection("GL_INVALID_ENUM is generated if pname is a non-scalar parameter.");
		ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_BORDER_COLOR, 0.0f);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.endSection();
	}

	ctx.beginSection("GL_INVALID_ENUM error is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname is not valid.");
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_BORDER_COLOR, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MIN_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MAG_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_S, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_T, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_R, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MIN_LOD, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MAX_LOD, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_COMPARE_MODE, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_COMPARE_FUNC, textureMode);
	ctx.expectError(GL_INVALID_ENUM);

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
	{
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_BORDER_COLOR, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MIN_FILTER, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MAG_FILTER, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_S, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_T, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_R, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MIN_LOD, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MAX_LOD, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_COMPARE_MODE, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_COMPARE_FUNC, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
	}
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname GL_TEXTURE_BASE_LEVEL is not 0.");
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_BASE_LEVEL, 1.0f);
	ctx.expectError(GL_INVALID_OPERATION);

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
	{
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_BASE_LEVEL, 1.0f);
		ctx.expectError(GL_INVALID_OPERATION);
	}
	ctx.endSection();

	ctx.glDeleteTextures(1, &texture);
}